

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSModuleDef * JS_RunModule(JSContext *ctx,char *basename,char *filename)

{
  int iVar1;
  JSValueUnion m;
  JSRefCountHeader *p;
  JSValue JVar2;
  
  m.ptr = js_host_resolve_imported_module(ctx,basename,filename);
  if ((JSModuleDef *)m.ptr != (JSModuleDef *)0x0) {
    iVar1 = js_resolve_module(ctx,(JSModuleDef *)m.ptr);
    if (iVar1 < 0) {
      js_free_modules(ctx,JS_FREE_MODULE_NOT_RESOLVED);
    }
    else {
      *(int *)m.ptr = *m.ptr + 1;
      JVar2.tag = -3;
      JVar2.u.ptr = m.ptr;
      JVar2 = JS_EvalFunction(ctx,JVar2);
      if ((int)JVar2.tag != 6) {
        JS_FreeValue(ctx,JVar2);
        return (JSModuleDef *)m.float64;
      }
    }
  }
  return (JSModuleDef *)0x0;
}

Assistant:

JSModuleDef *JS_RunModule(JSContext *ctx, const char *basename,
                          const char *filename)
{
    JSModuleDef *m;
    JSValue ret, func_obj;
    
    m = js_host_resolve_imported_module(ctx, basename, filename);
    if (!m)
        return NULL;
    
    if (js_resolve_module(ctx, m) < 0) {
        js_free_modules(ctx, JS_FREE_MODULE_NOT_RESOLVED);
        return NULL;
    }

    /* Evaluate the module code */
    func_obj = JS_DupValue(ctx, JS_MKPTR(JS_TAG_MODULE, m));
    ret = JS_EvalFunction(ctx, func_obj);
    if (JS_IsException(ret))
        return NULL;
    JS_FreeValue(ctx, ret);
    return m;
}